

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall pugi::xml_node::prepend_child(xml_node *this,xml_node_type type_)

{
  bool bVar1;
  xml_node_type parent;
  xml_allocator *this_00;
  xml_node_struct *p;
  xml_node_type in_ESI;
  xml_node *in_RDI;
  xml_node n;
  xml_allocator *alloc;
  xml_node local_28;
  undefined4 in_stack_ffffffffffffffe8;
  xml_node *rhs;
  xml_node in_stack_fffffffffffffff8;
  
  rhs = in_RDI;
  parent = type(in_RDI);
  bVar1 = impl::anon_unknown_0::allow_insert_child(parent,in_ESI);
  if (bVar1) {
    this_00 = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(in_RDI->_root);
    bVar1 = impl::anon_unknown_0::xml_allocator::reserve(this_00);
    if (bVar1) {
      p = impl::anon_unknown_0::allocate_node
                    ((xml_allocator *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                     (xml_node_type)((ulong)this_00 >> 0x20));
      xml_node(&local_28,p);
      bVar1 = operator!(&local_28);
      if (bVar1) {
        xml_node((xml_node *)&stack0xfffffffffffffff8);
        local_28._root = in_stack_fffffffffffffff8._root;
      }
      else {
        impl::anon_unknown_0::prepend_node(local_28._root,in_RDI->_root);
        if (in_ESI == node_declaration) {
          set_name((xml_node *)in_stack_fffffffffffffff8._root,(char_t *)rhs);
        }
      }
    }
    else {
      xml_node((xml_node *)&stack0xfffffffffffffff8);
      local_28._root = in_stack_fffffffffffffff8._root;
    }
  }
  else {
    xml_node((xml_node *)&stack0xfffffffffffffff8);
    local_28._root = in_stack_fffffffffffffff8._root;
  }
  return (xml_node)local_28._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::prepend_child(xml_node_type type_)
	{
		if (!impl::allow_insert_child(type(), type_)) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::prepend_node(n._root, _root);

		if (type_ == node_declaration) n.set_name(PUGIXML_TEXT("xml"));

		return n;
	}